

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_array.h
# Opt level: O0

iterator __thiscall re2::SparseArray<int>::set_new(SparseArray<int> *this,int i,int v)

{
  bool bVar1;
  int v_local;
  int i_local;
  SparseArray<int> *this_local;
  
  DebugCheckInvariants(this);
  if ((uint)i < (uint)this->max_size_) {
    bVar1 = has_index(this,i);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      __assert_fail("!has_index(i)",
                    "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/util/sparse_array.h"
                    ,0x186,
                    "typename SparseArray<Value>::iterator re2::SparseArray<int>::set_new(int, Value) [Value = int]"
                   );
    }
    create_index(this,i);
    this_local = (SparseArray<int> *)set_existing(this,i,v);
  }
  else {
    this_local = (SparseArray<int> *)begin(this);
  }
  return (iterator)(IndexValue *)this_local;
}

Assistant:

typename SparseArray<Value>::iterator
SparseArray<Value>::set_new(int i, Value v) {
  DebugCheckInvariants();
  if (static_cast<uint>(i) >= static_cast<uint>(max_size_)) {
    // Semantically, end() would be better here, but we already know
    // the user did something stupid, so begin() insulates them from
    // dereferencing an invalid pointer.
    return begin();
  }
  DCHECK(!has_index(i));
  create_index(i);
  return set_existing(i, v);
}